

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWSLoader.cpp
# Opt level: O3

void __thiscall Assimp::LWS::Element::Parse(Element *this,char **buffer)

{
  byte *pbVar1;
  int iVar2;
  byte *pbVar3;
  long lVar4;
  char *pcVar5;
  Logger *this_00;
  undefined1 *puVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  byte bVar8;
  list<Assimp::LWS::Element,_std::allocator<Assimp::LWS::Element>_> *this_01;
  undefined8 uStack_98;
  list<Assimp::LWS::Element,_std::allocator<Assimp::LWS::Element>_> *local_90;
  Element local_88;
  
  local_90 = &this->children;
  pbVar3 = (byte *)*buffer;
  while( true ) {
    while( true ) {
      this_01 = &local_88.children;
      if ((0x20 < (ulong)*pbVar3) || ((0x100002600U >> ((ulong)*pbVar3 & 0x3f) & 1) == 0)) break;
      pbVar3 = pbVar3 + 1;
    }
    *buffer = (char *)pbVar3;
    uStack_98._7_1_ = *pbVar3;
    if (uStack_98._7_1_ == 0) break;
    if (uStack_98._7_1_ == 0x7b) {
      pbVar3 = pbVar3 + 1;
      *buffer = (char *)pbVar3;
      for (; (*pbVar3 == 0x20 || (*pbVar3 == 9)); pbVar3 = pbVar3 + 1) {
      }
      *buffer = (char *)pbVar3;
    }
    else if (uStack_98._7_1_ == 0x7d) {
      return;
    }
    lVar4 = 0x10;
    do {
      puVar6 = (undefined1 *)((long)&local_88.tokens[0]._M_dataplus._M_p + lVar4);
      *(undefined1 **)((long)&uStack_98 + lVar4) = puVar6;
      *(undefined8 *)((long)local_88.tokens + lVar4 + -8) = 0;
      *puVar6 = 0;
      lVar4 = lVar4 + 0x20;
    } while (lVar4 != 0x50);
    local_88.children.super__List_base<Assimp::LWS::Element,_std::allocator<Assimp::LWS::Element>_>.
    _M_impl._M_node._M_size = 0;
    local_88.children.super__List_base<Assimp::LWS::Element,_std::allocator<Assimp::LWS::Element>_>.
    _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)this_01;
    local_88.children.super__List_base<Assimp::LWS::Element,_std::allocator<Assimp::LWS::Element>_>.
    _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)this_01;
    std::__cxx11::list<Assimp::LWS::Element,_std::allocator<Assimp::LWS::Element>_>::
    _M_insert<Assimp::LWS::Element>(local_90,(iterator)local_90,&local_88);
    std::__cxx11::_List_base<Assimp::LWS::Element,_std::allocator<Assimp::LWS::Element>_>::_M_clear
              (&this_01->
                super__List_base<Assimp::LWS::Element,_std::allocator<Assimp::LWS::Element>_>);
    lVar4 = -0x40;
    paVar7 = &local_88.tokens[1].field_2;
    do {
      if (paVar7 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(&paVar7->_M_allocated_capacity)[-2]) {
        operator_delete((long *)(&paVar7->_M_allocated_capacity)[-2],
                        paVar7->_M_allocated_capacity + 1);
      }
      paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(&paVar7->_M_allocated_capacity + -4);
      lVar4 = lVar4 + 0x20;
    } while (lVar4 != 0);
    pbVar3 = (byte *)*buffer;
    while ((0x20 < (ulong)*pbVar3 || ((0x100003601U >> ((ulong)*pbVar3 & 0x3f) & 1) == 0))) {
      pbVar3 = pbVar3 + 1;
      *buffer = (char *)pbVar3;
    }
    paVar7 = &local_88.tokens[0].field_2;
    local_88.tokens[0]._M_dataplus._M_p = (pointer)paVar7;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88);
    std::__cxx11::string::operator=
              ((string *)
               ((this->children).
                super__List_base<Assimp::LWS::Element,_std::allocator<Assimp::LWS::Element>_>.
                _M_impl._M_node.super__List_node_base._M_prev + 1),(string *)&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88.tokens[0]._M_dataplus._M_p != paVar7) {
      operator_delete(local_88.tokens[0]._M_dataplus._M_p,
                      local_88.tokens[0].field_2._M_allocated_capacity + 1);
    }
    for (pcVar5 = *buffer; (*pcVar5 == ' ' || (*pcVar5 == '\t')); pcVar5 = pcVar5 + 1) {
    }
    *buffer = pcVar5;
    iVar2 = std::__cxx11::string::compare
                      ((char *)((this->children).
                                super__List_base<Assimp::LWS::Element,_std::allocator<Assimp::LWS::Element>_>
                                ._M_impl._M_node.super__List_node_base._M_prev + 1));
    if (iVar2 == 0) {
      this_00 = DefaultLogger::get();
      Logger::debug(this_00,"LWS: Skipping over plugin-specific data");
      pbVar3 = (byte *)*buffer;
      while( true ) {
        while (((ulong)*pbVar3 < 0x21 && ((0x100002600U >> ((ulong)*pbVar3 & 0x3f) & 1) != 0))) {
          pbVar3 = pbVar3 + 1;
        }
        *buffer = (char *)pbVar3;
        bVar8 = *pbVar3;
        if ((bVar8 == 0) || (iVar2 = strncmp((char *)pbVar3,"EndPlugin",9), iVar2 == 0)) break;
        while ((0xd < bVar8 || ((0x2401U >> (bVar8 & 0x1f) & 1) == 0))) {
          bVar8 = pbVar3[1];
          pbVar3 = pbVar3 + 1;
        }
        while ((bVar8 == 0xd || (bVar8 == 10))) {
          pbVar1 = pbVar3 + 1;
          pbVar3 = pbVar3 + 1;
          bVar8 = *pbVar1;
        }
        *buffer = (char *)pbVar3;
      }
    }
    else {
      pbVar3 = (byte *)*buffer;
      while ((0xd < *pbVar3 || ((0x3401U >> (*pbVar3 & 0x1f) & 1) == 0))) {
        pbVar3 = pbVar3 + 1;
        *buffer = (char *)pbVar3;
      }
      paVar7 = &local_88.tokens[0].field_2;
      local_88.tokens[0]._M_dataplus._M_p = (pointer)paVar7;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88);
      std::__cxx11::string::operator=
                ((string *)
                 ((this->children).
                  super__List_base<Assimp::LWS::Element,_std::allocator<Assimp::LWS::Element>_>.
                  _M_impl._M_node.super__List_node_base._M_prev + 3),(string *)&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88.tokens[0]._M_dataplus._M_p != paVar7) {
        operator_delete(local_88.tokens[0]._M_dataplus._M_p,
                        local_88.tokens[0].field_2._M_allocated_capacity + 1);
      }
      if (uStack_98._7_1_ == 0x7b) {
        Parse((Element *)
              ((this->children).
               super__List_base<Assimp::LWS::Element,_std::allocator<Assimp::LWS::Element>_>._M_impl
               ._M_node.super__List_node_base._M_prev + 1),buffer);
      }
    }
    pbVar3 = (byte *)*buffer;
    while( true ) {
      bVar8 = *pbVar3;
      if ((bVar8 < 0xe) && ((0x2401U >> (bVar8 & 0x1f) & 1) != 0)) break;
      pbVar3 = pbVar3 + 1;
    }
    while ((bVar8 == 0xd || (bVar8 == 10))) {
      pbVar1 = pbVar3 + 1;
      pbVar3 = pbVar3 + 1;
      bVar8 = *pbVar1;
    }
    *buffer = (char *)pbVar3;
  }
  return;
}

Assistant:

void LWS::Element::Parse (const char*& buffer)
{
    for (;SkipSpacesAndLineEnd(&buffer);SkipLine(&buffer)) {

        // begin of a new element with children
        bool sub = false;
        if (*buffer == '{') {
            ++buffer;
            SkipSpaces(&buffer);
            sub = true;
        }
        else if (*buffer == '}')
            return;

        children.push_back(Element());

        // copy data line - read token per token

        const char* cur = buffer;
        while (!IsSpaceOrNewLine(*buffer)) ++buffer;
        children.back().tokens[0] = std::string(cur,(size_t) (buffer-cur));
        SkipSpaces(&buffer);

        if (children.back().tokens[0] == "Plugin")
        {
            ASSIMP_LOG_DEBUG("LWS: Skipping over plugin-specific data");

            // strange stuff inside Plugin/Endplugin blocks. Needn't
            // follow LWS syntax, so we skip over it
            for (;SkipSpacesAndLineEnd(&buffer);SkipLine(&buffer)) {
                if (!::strncmp(buffer,"EndPlugin",9)) {
                    //SkipLine(&buffer);
                    break;
                }
            }
            continue;
        }

        cur = buffer;
        while (!IsLineEnd(*buffer)) ++buffer;
        children.back().tokens[1] = std::string(cur,(size_t) (buffer-cur));

        // parse more elements recursively
        if (sub)
            children.back().Parse(buffer);
    }
}